

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

bool __thiscall
Js::PolymorphicInlineCache::HasDifferentType<false>
          (PolymorphicInlineCache *this,bool isProto,Type *type,Type *typeWithoutProperty)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (typeWithoutProperty != (Type *)0x0 && isProto) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x278,"(!isAccessor && !isProto || !typeWithoutProperty)",
                                "!isAccessor && !isProto || !typeWithoutProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = InlineCache::HasDifferentType<false>
                    (this->inlineCaches + ((uint)((ulong)type >> 6) & this->size - 1),isProto,type,
                     typeWithoutProperty);
  bVar3 = true;
  if (!bVar2) {
    if (typeWithoutProperty != (Type *)0x0 && !isProto) {
      bVar2 = InlineCache::HasDifferentType<false>
                        (this->inlineCaches +
                         ((uint)((ulong)typeWithoutProperty >> 6) & this->size - 1),isProto,type,
                         typeWithoutProperty);
      return bVar2;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PolymorphicInlineCache::HasDifferentType(
        const bool isProto,
        const Type * type,
        const Type * typeWithoutProperty) const
    {
        Assert(!isAccessor && !isProto || !typeWithoutProperty);

        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
        if (inlineCaches[inlineCacheIndex].HasDifferentType<isAccessor>(isProto, type, typeWithoutProperty))
        {
            return true;
        }

        if (!isAccessor && !isProto && typeWithoutProperty)
        {
            inlineCacheIndex = GetInlineCacheIndexForType(typeWithoutProperty);
            return inlineCaches[inlineCacheIndex].HasDifferentType<isAccessor>(isProto, type, typeWithoutProperty);
        }

        return false;
    }